

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O0

String * __thiscall StringList::join(String *__return_storage_ptr__,StringList *this,String *delim)

{
  bool bVar1;
  deque<String,_std::allocator<String>_> *this_00;
  String local_c8;
  String local_a8;
  reference local_88;
  String *it;
  const_iterator __end1;
  const_iterator __begin1;
  deque<String,_std::allocator<String>_> *__range1;
  String *delim_local;
  StringList *this_local;
  String *result;
  
  String::String(__return_storage_ptr__);
  this_00 = List<String>::deque(&this->super_List<String>);
  std::deque<String,_std::allocator<String>_>::begin((const_iterator *)&__end1._M_node,this_00);
  std::deque<String,_std::allocator<String>_>::end((const_iterator *)&it,this_00);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&it), bVar1) {
    local_88 = std::_Deque_iterator<String,_const_String_&,_const_String_*>::operator*
                         ((_Deque_iterator<String,_const_String_&,_const_String_*> *)&__end1._M_node
                         );
    bVar1 = String::isEmpty(__return_storage_ptr__);
    if (!bVar1) {
      String::String(&local_a8,delim);
      String::operator+=(__return_storage_ptr__,&local_a8);
      String::~String(&local_a8);
    }
    String::String(&local_c8,local_88);
    String::operator+=(__return_storage_ptr__,&local_c8);
    String::~String(&local_c8);
    std::_Deque_iterator<String,_const_String_&,_const_String_*>::operator++
              ((_Deque_iterator<String,_const_String_&,_const_String_*> *)&__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringList::join (const String& delim)
{
	String result;

	for (const String& it : deque())
	{
		if (result.isEmpty() == false)
			result += delim;

		result += it;
	}

	return result;
}